

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

void am_check_list_slot(Am_Slot_Key slot,Am_Value *v,Am_Object *created_obj,
                       Am_Value_List *slots_to_save,Am_Value_List *pos_slots)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value local_40;
  Am_Value_List *local_30;
  Am_Value_List *pos_slots_local;
  Am_Value_List *slots_to_save_local;
  Am_Object *created_obj_local;
  Am_Value *v_local;
  Am_Slot_Key slot_local;
  
  local_30 = pos_slots;
  pos_slots_local = slots_to_save;
  slots_to_save_local = (Am_Value_List *)created_obj;
  created_obj_local = (Am_Object *)v;
  v_local._6_2_ = slot;
  Am_Value::Am_Value(&local_40,(uint)slot);
  bVar1 = Am_Value_List::Start_Member(slots_to_save,&local_40);
  Am_Value::~Am_Value(&local_40);
  if (bVar1) {
    Am_Value_List::Delete(pos_slots_local,false);
    Am_Value_List::Add(local_30,(uint)v_local._6_2_,Am_TAIL,true);
    bVar1 = Am_Object::Valid((Am_Object *)slots_to_save_local);
    if (bVar1) {
      in_value = Am_Object::Get((Am_Object *)slots_to_save_local,v_local._6_2_,0);
      Am_Value::operator=((Am_Value *)created_obj_local,in_value);
    }
  }
  return;
}

Assistant:

void
am_check_list_slot(Am_Slot_Key slot, Am_Value &v, Am_Object &created_obj,
                   Am_Value_List &slots_to_save, Am_Value_List &pos_slots)
{
  if (slots_to_save.Start_Member(slot)) {
    slots_to_save.Delete(false); //remove it
    pos_slots.Add(slot);
    if (created_obj.Valid())
      v = created_obj.Get(slot);
  }
}